

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O3

__sighandler_t __thiscall tlx::Semaphore::signal(Semaphore *this,int __sig,__sighandler_t __handler)

{
  __sighandler_t p_Var1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  p_Var1 = (__sighandler_t)(this->value_ + 1);
  this->value_ = (size_t)p_Var1;
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return p_Var1;
}

Assistant:

size_t signal() {
        std::unique_lock<std::mutex> lock(mutex_);
        size_t res = ++value_;
        cv_.notify_one();
        return res;
    }